

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void LenEnc_Encode2(CLenPriceEnc *p,CRangeEnc *rc,UInt32 symbol,UInt32 posState,
                   Bool_conflict updatePrice,UInt32 *ProbPrices)

{
  int iVar1;
  uint in_ECX;
  long in_RDI;
  int in_R8D;
  CRangeEnc *in_R9;
  undefined4 in_stack_ffffffffffffffe0;
  
  LenEnc_Encode((CLenEnc *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),in_R9,0,0x11e0b6);
  if ((in_R8D != 0) &&
     (iVar1 = *(int *)(in_RDI + 0x4808 + (ulong)in_ECX * 4) + -1,
     *(int *)(in_RDI + 0x4808 + (ulong)in_ECX * 4) = iVar1, iVar1 == 0)) {
    LenPriceEnc_UpdateTable
              ((CLenPriceEnc *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
               (UInt32)((ulong)in_R9 >> 0x20),(UInt32 *)0x11e0f0);
  }
  return;
}

Assistant:

static void LenEnc_Encode2(CLenPriceEnc *p, CRangeEnc *rc, UInt32 symbol, UInt32 posState, Bool updatePrice, const UInt32 *ProbPrices)
{
  LenEnc_Encode(&p->p, rc, symbol, posState);
  if (updatePrice)
    if (--p->counters[posState] == 0)
      LenPriceEnc_UpdateTable(p, posState, ProbPrices);
}